

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O2

void nn_bws_destroy(void *self)

{
  if (*(int *)((long)self + 0x58) == 1) {
    nn_list_term((nn_list *)((long)self + 0x2d0));
    if (*(long *)((long)self + 0x2c8) == 0) {
      nn_usock_term((nn_usock *)((long)self + 0x68));
      nn_fsm_term((nn_fsm *)self);
      nn_free(self);
      return;
    }
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bws->aws == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0xac);
  }
  else {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)((long)self + 0x58),
            "NN_BWS_STATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
            ,0xaa);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_bws_destroy (void *self)
{
    struct nn_bws *bws = self;

    nn_assert_state (bws, NN_BWS_STATE_IDLE);
    nn_list_term (&bws->awss);
    nn_assert (bws->aws == NULL);
    nn_usock_term (&bws->usock);
    nn_fsm_term (&bws->fsm);

    nn_free (bws);
}